

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print_resources(Compiler *compiler,StorageClass storage,
                    SmallVector<spirv_cross::BuiltInResource,_8UL> *resources)

{
  size_t sVar1;
  BuiltInResource *pBVar2;
  bool bVar3;
  uint uVar4;
  SPIRType *pSVar5;
  char *pcVar6;
  char *in_R8;
  char cVar7;
  long lVar8;
  uint32_t array_size;
  allocator local_f1;
  BuiltInResource *local_f0;
  StorageClass local_e4;
  string builtin_str;
  string type_str;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pcVar6 = "builtin outputs";
  if (storage == StorageClassInput) {
    pcVar6 = "builtin inputs";
  }
  local_e4 = storage;
  fprintf(_stderr,"%s\n",pcVar6);
  fwrite("=============\n\n",0xf,1,_stderr);
  local_f0 = (resources->super_VectorView<spirv_cross::BuiltInResource>).ptr;
  sVar1 = (resources->super_VectorView<spirv_cross::BuiltInResource>).buffer_size;
  for (lVar8 = 0; pBVar2 = local_f0, sVar1 * 0x38 != lVar8; lVar8 = lVar8 + 0x38) {
    bVar3 = spirv_cross::Compiler::has_active_builtin
                      (compiler,*(BuiltIn *)((long)&local_f0->builtin + lVar8),local_e4);
    pSVar5 = spirv_cross::Compiler::get_type
                       (compiler,(TypeID)*(uint32_t *)((long)&(pBVar2->value_type_id).id + lVar8));
    uVar4 = *(int *)&(pSVar5->super_IVariant).field_0xc - 7;
    pcVar6 = "?";
    if (uVar4 < 7) {
      pcVar6 = &DAT_0038cbec + *(int *)(&DAT_0038cbec + (ulong)uVar4 * 4);
    }
    array_size = 0;
    if ((pSVar5->array).super_VectorView<unsigned_int>.buffer_size == 0) {
      cVar7 = '\0';
    }
    else {
      array_size = *(pSVar5->array).super_VectorView<unsigned_int>.ptr;
      cVar7 = *(pSVar5->array_size_literal).super_VectorView<bool>.ptr;
    }
    std::__cxx11::string::string((string *)&type_str,pcVar6,(allocator *)&builtin_str);
    if (1 < pSVar5->vecsize) {
      std::__cxx11::to_string(&builtin_str,pSVar5->vecsize);
      std::__cxx11::string::append((string *)&type_str);
      std::__cxx11::string::~string((string *)&builtin_str);
    }
    if (array_size != 0) {
      if (cVar7 == '\0') {
        spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[21]>
                  (&builtin_str,(spirv_cross *)0x3a24a1,(char (*) [2])&array_size,
                   (uint *)" (spec constant ID)]",(char (*) [21])in_R8);
        std::__cxx11::string::append((string *)&type_str);
      }
      else {
        spirv_cross::join<char_const(&)[2],unsigned_int&,char_const(&)[2]>
                  (&builtin_str,(spirv_cross *)0x3a24a1,(char (*) [2])&array_size,(uint *)0x3a23a6,
                   (char (*) [2])in_R8);
        std::__cxx11::string::append((string *)&type_str);
      }
      std::__cxx11::string::~string((string *)&builtin_str);
    }
    builtin_str._M_dataplus._M_p = (pointer)&builtin_str.field_2;
    builtin_str._M_string_length = 0;
    builtin_str.field_2._M_local_buf[0] = '\0';
    uVar4 = *(uint *)((long)&local_f0->builtin + lVar8);
    if ((uVar4 < 0xd) && ((0x181bU >> (uVar4 & 0x1f) & 1) != 0)) {
      std::__cxx11::string::assign((char *)&builtin_str);
    }
    else {
      std::__cxx11::string::string((string *)&local_70,"builtin #",&local_f1);
      std::__cxx11::to_string(&local_90,*(int *)((long)&local_f0->builtin + lVar8));
      std::operator+(&local_50,&local_70,&local_90);
      std::__cxx11::string::operator=((string *)&builtin_str,(string *)&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_70);
    }
    in_R8 = "no";
    if (bVar3) {
      in_R8 = "yes";
    }
    fprintf(_stderr,"Builtin %s (%s) (active: %s).\n",builtin_str._M_dataplus._M_p,
            type_str._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&builtin_str);
    std::__cxx11::string::~string((string *)&type_str);
  }
  fwrite("=============\n\n",0xf,1,_stderr);
  return;
}

Assistant:

static void print_resources(const Compiler &compiler, spv::StorageClass storage,
                            const SmallVector<BuiltInResource> &resources)
{
	fprintf(stderr, "%s\n", storage == StorageClassInput ? "builtin inputs" : "builtin outputs");
	fprintf(stderr, "=============\n\n");
	for (auto &res : resources)
	{
		bool active = compiler.has_active_builtin(res.builtin, storage);
		const char *basetype = "?";
		auto &type = compiler.get_type(res.value_type_id);
		switch (type.basetype)
		{
		case SPIRType::Float: basetype = "float"; break;
		case SPIRType::Int: basetype = "int"; break;
		case SPIRType::UInt: basetype = "uint"; break;
		default: break;
		}

		uint32_t array_size = 0;
		bool array_size_literal = false;
		if (!type.array.empty())
		{
			array_size = type.array.front();
			array_size_literal = type.array_size_literal.front();
		}

		string type_str = basetype;
		if (type.vecsize > 1)
			type_str += std::to_string(type.vecsize);

		if (array_size)
		{
			if (array_size_literal)
				type_str += join("[", array_size, "]");
			else
				type_str += join("[", array_size, " (spec constant ID)]");
		}

		string builtin_str;
		switch (res.builtin)
		{
		case spv::BuiltInPosition: builtin_str = "Position"; break;
		case spv::BuiltInPointSize: builtin_str = "PointSize"; break;
		case spv::BuiltInCullDistance: builtin_str = "CullDistance"; break;
		case spv::BuiltInClipDistance: builtin_str = "ClipDistance"; break;
		case spv::BuiltInTessLevelInner: builtin_str = "TessLevelInner"; break;
		case spv::BuiltInTessLevelOuter: builtin_str = "TessLevelOuter"; break;
		default: builtin_str = string("builtin #") + to_string(res.builtin);
		}

		fprintf(stderr, "Builtin %s (%s) (active: %s).\n", builtin_str.c_str(), type_str.c_str(), active ? "yes" : "no");
	}
	fprintf(stderr, "=============\n\n");
}